

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O1

void __thiscall Corrade::Utility::Debug::resetColorInternal(Debug *this)

{
  byte bVar1;
  ostream *poVar2;
  size_t sVar3;
  undefined1 uVar4;
  char *__s;
  long in_FS_OFFSET;
  char code [10];
  Error local_40;
  
  poVar2 = this->_output;
  if (poVar2 == (ostream *)0x0) {
    return;
  }
  bVar1 = (this->_internalFlags)._value;
  if ((bVar1 & 4) == 0) {
    return;
  }
  (this->_internalFlags)._value = bVar1 & 0xf9 | 2;
  if ((bVar1 & 0x18) == 0) {
    if (this->_previousColor == Default) {
      __s = "\x1b[0m";
      sVar3 = 4;
      goto LAB_00112b5c;
    }
    local_40.super_Debug._output =
         (ostream *)CONCAT26(0x6d,CONCAT15(this->_previousColor + 0x30,0x333b305b1b));
  }
  else {
    if ((~bVar1 & 0x18) == 0) {
      local_40.super_Debug._previousGlobalOutput = *(ostream **)(in_FS_OFFSET + -0x20);
      local_40.super_Debug._flags._value = '\0';
      local_40.super_Debug._immediateFlags._value = '\x04';
      local_40.super_Debug._internalFlags._value = 0;
      local_40.super_Debug._sourceLocationLine = 0;
      local_40.super_Debug._sourceLocationFile = (char *)0x0;
      local_40.super_Debug._previousColor = *(Color *)(in_FS_OFFSET + -8);
      if (*(char *)(in_FS_OFFSET + -7) == '\x01') {
        local_40.super_Debug._internalFlags._value = 8;
      }
      if (*(char *)(in_FS_OFFSET + -6) == '\x01') {
        local_40.super_Debug._internalFlags._value =
             local_40.super_Debug._internalFlags._value | 0x10;
      }
      local_40._previousGlobalErrorOutput = *(ostream **)(in_FS_OFFSET + -0x10);
      local_40.super_Debug._output = (ostream *)&std::cerr;
      *(undefined8 **)(in_FS_OFFSET + -0x10) = &std::cerr;
      operator<<(&local_40.super_Debug,
                 "Assertion !(_internalFlags >= InternalFlag::PreviousColorBold) || !(_internalFlags >= InternalFlag::PreviousColorInverted) failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Debug.cpp:412"
                );
      Error::~Error(&local_40);
      abort();
    }
    uVar4 = 0x31;
    if ((bVar1 & 8) == 0) {
      uVar4 = 0x37;
    }
    local_40.super_Debug._output =
         (ostream *)
         CONCAT17(this->_previousColor + 0x30,CONCAT25(0x333b,CONCAT14(uVar4,0x3b305b1b)));
    local_40.super_Debug._flags._value = 'm';
    local_40.super_Debug._immediateFlags._value = '\0';
  }
  __s = (char *)&local_40;
  sVar3 = strlen(__s);
LAB_00112b5c:
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  *(Color *)(in_FS_OFFSET + -8) = this->_previousColor;
  bVar1 = (this->_internalFlags)._value;
  *(byte *)(in_FS_OFFSET + -7) = bVar1 >> 3 & 1;
  *(byte *)(in_FS_OFFSET + -6) = bVar1 >> 4 & 1;
  return;
}

Assistant:

inline void Debug::resetColorInternal() {
    if(!_output || !(_internalFlags & InternalFlag::ColorWritten))
        return;

    _internalFlags &= ~InternalFlag::ColorWritten;
    _internalFlags |= InternalFlag::ValueWritten;
    #if defined(CORRADE_TARGET_WINDOWS) && !defined(CORRADE_UTILITY_USE_ANSI_COLORS)
    HANDLE h = streamOutputHandle(_output);
    if(h != INVALID_HANDLE_VALUE)
        SetConsoleTextAttribute(h, _previousColorAttributes);
    #else
    if(_internalFlags >= InternalFlag::PreviousColorBold || _internalFlags >= InternalFlag::PreviousColorInverted) {
        /* Only one of the two should be set by our code */
        CORRADE_INTERNAL_ASSERT(!(_internalFlags >= InternalFlag::PreviousColorBold) || !(_internalFlags >= InternalFlag::PreviousColorInverted));
        const char code[]{'\033', '[', '0', ';', _internalFlags >= InternalFlag::PreviousColorBold ? '1' : '7', ';', '3', char('0' + char(_previousColor)), 'm', '\0'};
        *_output << code;
    } else if(_previousColor != Color::Default) {
        const char code[]{'\033', '[', '0', ';', '3', char('0' + char(_previousColor)), 'm', '\0'};
        *_output << code;
    } else *_output << "\033[0m";

    debugGlobals.color = _previousColor;
    debugGlobals.colorBold = _internalFlags >= InternalFlag::PreviousColorBold;
    debugGlobals.colorInverted = _internalFlags >= InternalFlag::PreviousColorInverted;
    #endif
}